

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

CHAR LocalRegionGrayValue6redict65(IplImage *pImage)

{
  INT32U IVar1;
  INT8U *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  UINT count_of_gray [256];
  UINT aUStack_418 [258];
  
  memset(aUStack_418,0,0x400);
  pIVar2 = pImage->imageData;
  IVar1 = pImage->widthStep;
  iVar5 = IVar1 * 6 + 1;
  iVar7 = 6;
  do {
    lVar8 = 0;
    do {
      aUStack_418[pIVar2[(uint)(iVar5 + (int)lVar8)]] =
           aUStack_418[pIVar2[(uint)(iVar5 + (int)lVar8)]] + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    iVar7 = iVar7 + 1;
    iVar5 = iVar5 + IVar1;
  } while (iVar7 != 0xe);
  uVar6 = get_best_threshold(aUStack_418);
  iVar5 = IVar1 * 6 + 1;
  iVar7 = 6;
  bVar3 = false;
  bVar4 = false;
  do {
    lVar8 = 0;
    iVar9 = 0;
    do {
      iVar9 = (iVar9 + 1) - (uint)(uVar6 < pIVar2[(uint)(iVar5 + (int)lVar8)]);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    if ((bVar3) && (iVar9 != 0)) {
      return '5';
    }
    if (bVar4 && iVar9 == 0) {
      bVar3 = true;
    }
    if (iVar9 != 0) {
      bVar4 = true;
    }
    iVar7 = iVar7 + 1;
    iVar5 = iVar5 + IVar1;
  } while (iVar7 != 0xe);
  return '6' - !bVar4;
}

Assistant:

CHAR LocalRegionGrayValue6redict65(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value = 0;
    INT32U is_white = 0, white_to_black = 0;

    //    区域 [6:14,1:7]
    UINT count_of_gray[256] = {0};
    int best_threshold;

    for (row = 6; row < 14; row++) {
        for (col = 1; col < 7; col++) {
            // get the pixel,
            locate_value = pImage->imageData[row * pImage->widthStep + col];
            count_of_gray[locate_value] += 1;

        }
    }
    //    寻找 最优 二值化 阈值
    best_threshold = get_best_threshold(count_of_gray);

    for (row = 6; row < 14; row++) {
//        计算这一行 二值化后 灰度值大小
        sum_value = 0;
        for (col = 1; col < 7; col++) {
            // get the pixel
            locate_value = pImage->imageData[row * pImage->widthStep + col];
//            二值化,背景是黑色（0），前景是白色（1）
            if (locate_value <= best_threshold)
                locate_value = 1;
            else
                locate_value = 0;

            sum_value += locate_value;
        }

        if (white_to_black == 1 && sum_value > 0) {
//            白转黑 又转白
            return '5';
        }

        if (is_white == 1 && sum_value == 0) {
//            白转黑
            white_to_black = 1;
        }

        if (sum_value > 0)
            is_white = 1;

    }

    if (is_white == 0)
//        非环
        return '5';
    else
        return '6';
}